

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

size_t fct_ts__tst_cnt_passed(fct_ts_t *ts)

{
  size_t sVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (ts == (fct_ts_t *)0x0) {
    __assert_fail("ts != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x52a
                  ,"size_t fct_ts__tst_cnt_passed(const fct_ts_t *)");
  }
  if (ts->mode != ts_mode_end) {
    __assert_fail("((ts)->mode == ts_mode_end)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x52b
                  ,"size_t fct_ts__tst_cnt_passed(const fct_ts_t *)");
  }
  sVar1 = (ts->test_list).used_itm_num;
  if (sVar1 == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    sVar4 = 0;
    do {
      pvVar2 = (ts->test_list).itm_list[sVar4];
      if (pvVar2 == (void *)0x0) {
        __assert_fail("test != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x401,"int fct_test__is_pass(const fct_test_t *)");
      }
      sVar3 = sVar3 + (*(long *)((long)pvVar2 + 0x10) == 0);
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return sVar3;
}

Assistant:

static size_t
fct_ts__tst_cnt_passed(fct_ts_t const *ts)
{
    size_t tally =0;

    FCT_ASSERT( ts != NULL );
    FCT_ASSERT( fct_ts__is_end(ts) );

    FCT_NLIST_FOREACH_BGN(fct_test_t*, test, &(ts->test_list))
    {
        if ( fct_test__is_pass(test) )
        {
            tally += 1;
        }
    }
    FCT_NLIST_FOREACH_END();
    return tally;
}